

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

bool __thiscall cfd::core::ConfidentialTransaction::HasWitness(ConfidentialTransaction *this)

{
  int iVar1;
  size_t sStack_20;
  int ret;
  size_t is_witness;
  ConfidentialTransaction *this_local;
  
  sStack_20 = 0;
  is_witness = (size_t)this;
  iVar1 = wally_tx_get_witness_count
                    ((wally_tx *)(this->super_AbstractTransaction).wally_tx_pointer_,
                     &stack0xffffffffffffffe0);
  this_local._7_1_ = iVar1 == 0 && sStack_20 != 0;
  return this_local._7_1_;
}

Assistant:

bool ConfidentialTransaction::HasWitness() const {
  size_t is_witness = 0;
  int ret = wally_tx_get_witness_count(
      static_cast<struct wally_tx *>(wally_tx_pointer_), &is_witness);
  if (ret == WALLY_OK) {
    return (is_witness != 0);
  }
  return false;
}